

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O0

void __thiscall
npas4_ForceAllocateVirtual_Test::~npas4_ForceAllocateVirtual_Test
          (npas4_ForceAllocateVirtual_Test *this)

{
  npas4_ForceAllocateVirtual_Test *this_local;
  
  ~npas4_ForceAllocateVirtual_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(npas4, ForceAllocateVirtual)
{
	const auto ramAvailableTotal = npas4::GetRAMSystemAvailable();
	EXPECT_GT(ramAvailableTotal, 0);

	const auto ramSystemUsed = npas4::GetRAMSystemUsed();
	EXPECT_GT(ramSystemUsed, 0);

	const auto ramUsedByCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess();
	EXPECT_GT(ramUsedByCurrentProcess, 0);

	const auto ramAvailablePhysical = npas4::GetRAMPhysicalAvailable();
	EXPECT_GT(ramAvailablePhysical, 0);

	const auto ramAvailableVirtual = npas4::GetRAMVirtualAvailable();
	EXPECT_GT(ramAvailableVirtual, 0);

	const auto allocAmmountPhysical = ramAvailablePhysical;
	const auto allocAmmountVirtual = static_cast<decltype(allocAmmountPhysical)>(static_cast<double>(ramAvailableVirtual) * 0.01);
	const auto allocAmmount = allocAmmountPhysical + allocAmmountVirtual;

	EXPECT_GT(ramAvailableTotal, allocAmmount);
	EXPECT_GT(allocAmmount, ramAvailablePhysical);

	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		volatile uint8_t* buffer = new uint8_t[allocAmmount];

		// We should be using more RAM across the board now.
		EXPECT_GT(npas4::GetRAMSystemUsed(), ramSystemUsed);
		EXPECT_GT(npas4::GetRAMSystemUsedByCurrentProcess(), ramUsedByCurrentProcess);
		// EXPECT_NEAR(npas4::GetRAMSystemUsedByCurrentProcess(), ramUsedByCurrentProcess + allocAmmount, 4096);

		EXPECT_LT(npas4::GetRAMSystemAvailable(), ramAvailableTotal);
		EXPECT_LT(npas4::GetRAMPhysicalAvailable(), ramAvailablePhysical);
		// EXPECT_LT(npas4::GetRAMVirtualAvailable(), ramAvailableVirtual);

		delete[] buffer;
	}
}